

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall ncnn::PoolAllocator::fastFree(PoolAllocator *this,void *ptr)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->payouts_lock);
  p_Var3 = (_List_node_base *)&this->payouts;
  do {
    p_Var3 = (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&this->payouts) {
      fastFree();
      return;
    }
  } while (p_Var3[1]._M_prev != (_List_node_base *)ptr);
  p_Var2 = p_Var3[1]._M_next;
  psVar1 = &(this->payouts).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var3,0x20);
  pthread_mutex_unlock((pthread_mutex_t *)&this->payouts_lock);
  pthread_mutex_lock((pthread_mutex_t *)&this->budgets_lock);
  p_Var3 = (_List_node_base *)operator_new(0x20);
  p_Var3[1]._M_next = p_Var2;
  p_Var3[1]._M_prev = (_List_node_base *)ptr;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->budgets).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->budgets_lock);
  return;
}

Assistant:

void PoolAllocator::fastFree(void* ptr)
{
    payouts_lock.lock();

    // return to budgets
    std::list< std::pair<size_t, void*> >::iterator it = payouts.begin();
    for (; it != payouts.end(); it++)
    {
        if (it->second == ptr)
        {
            size_t size = it->first;

            payouts.erase(it);

            payouts_lock.unlock();

            budgets_lock.lock();

            budgets.push_back(std::make_pair(size, ptr));

            budgets_lock.unlock();

            return;
        }
    }

    payouts_lock.unlock();

    fprintf(stderr, "FATAL ERROR! pool allocator get wild %p\n", ptr);
    ncnn::fastFree(ptr);
}